

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O3

void printS16ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  int64_t iVar3;
  uint uVar4;
  char *fmt;
  ushort uVar5;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar3 = MCOperand_getImm(op);
  uVar5 = (ushort)iVar3;
  uVar4 = (uint)(short)uVar5;
  if ((short)uVar5 < 0) {
    uVar4 = -uVar4;
    if (uVar5 < 0xfff7) {
      fmt = "-0x%x";
    }
    else {
      fmt = "-%u";
    }
  }
  else if (uVar5 < 10) {
    fmt = "%u";
  }
  else {
    fmt = "0x%x";
  }
  SStream_concat(O,fmt,(ulong)uVar4);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x16;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x1e) =
         (long)(short)uVar5;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printS16ImmOperand(MCInst *MI, int OpNum, SStream *O)
{
	int16_t Value = (int16_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// assert(isInt<16>(Value) && "Invalid s16imm argument");

	if (Value >= 0) {
		if (Value > HEX_THRESHOLD)
			SStream_concat(O, "0x%x", Value);
		else
			SStream_concat(O, "%u", Value);
	} else {
		if (Value < -HEX_THRESHOLD)
			SStream_concat(O, "-0x%x", -Value);
		else
			SStream_concat(O, "-%u", -Value);
	}

	if (MI->csh->detail) {
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = (int64_t)Value;
		MI->flat_insn->detail->sysz.op_count++;
	}
}